

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void print_symbol(flatcc_json_printer_t *ctx,char *name,size_t len)

{
  size_t len_local;
  char *name_local;
  flatcc_json_printer_t *ctx_local;
  
  *ctx->p = '\"';
  ctx->p = ctx->p + (int)(uint)((ctx->unquote != '\0' ^ 0xffU) & 1);
  if (ctx->p + len < ctx->pflush) {
    memcpy(ctx->p,name,len);
    ctx->p = ctx->p + len;
  }
  else {
    print(ctx,name,len);
  }
  *ctx->p = '\"';
  ctx->p = ctx->p + (int)(uint)((ctx->unquote != '\0' ^ 0xffU) & 1);
  return;
}

Assistant:

static inline void print_symbol(flatcc_json_printer_t *ctx, const char *name, size_t len)
{
    *ctx->p = '\"';
    ctx->p += !ctx->unquote;
    if (ctx->p + len < ctx->pflush) {
        memcpy(ctx->p, name, len);
        ctx->p += len;
    } else {
        print(ctx, name, len);
    }
    *ctx->p = '\"';
    ctx->p += !ctx->unquote;
}